

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_SetPropertyInt64(JSContext *ctx,JSValue this_obj,int64_t idx,JSValue val)

{
  int iVar1;
  JSAtom prop;
  JSValue prop_00;
  
  if ((ulong)idx < 0x80000000) {
    prop_00.tag = 0;
    prop_00.u = (JSValueUnion)idx;
    iVar1 = JS_SetPropertyValue(ctx,this_obj,prop_00,val,0x4000);
  }
  else {
    prop = JS_NewAtomInt64(ctx,idx);
    if (prop == 0) {
      if ((0xfffffff4 < (uint)val.tag) &&
         (iVar1 = *val.u.ptr, *(int *)val.u.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,val);
      }
      iVar1 = -1;
    }
    else {
      iVar1 = JS_SetPropertyInternal(ctx,this_obj,prop,val,0x4000);
      JS_FreeAtom(ctx,prop);
    }
  }
  return iVar1;
}

Assistant:

int JS_SetPropertyInt64(JSContext *ctx, JSValueConst this_obj,
                        int64_t idx, JSValue val)
{
    JSAtom prop;
    int res;

    if ((uint64_t)idx <= INT32_MAX) {
        /* fast path for fast arrays */
        return JS_SetPropertyValue(ctx, this_obj, JS_NewInt32(ctx, idx), val,
                                   JS_PROP_THROW);
    }
    prop = JS_NewAtomInt64(ctx, idx);
    if (prop == JS_ATOM_NULL) {
        JS_FreeValue(ctx, val);
        return -1;
    }
    res = JS_SetProperty(ctx, this_obj, prop, val);
    JS_FreeAtom(ctx, prop);
    return res;
}